

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.h
# Opt level: O2

CBlockIndex * __thiscall CChain::Next(CChain *this,CBlockIndex *pindex)

{
  long lVar1;
  bool bVar2;
  CBlockIndex *pCVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = Contains(this,pindex);
  if (bVar2) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      pCVar3 = operator[](this,pindex->nHeight + 1);
      return pCVar3;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (CBlockIndex *)0x0;
  }
  __stack_chk_fail();
}

Assistant:

CBlockIndex* Next(const CBlockIndex* pindex) const
    {
        if (Contains(pindex))
            return (*this)[pindex->nHeight + 1];
        else
            return nullptr;
    }